

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::ret<(SM83::Conditions)1>(SM83 *this)

{
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>_>
  fmt;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  u64 cycles;
  unsigned_short local_18 [4];
  char *local_10;
  
  local_18[0] = 1;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_10 = "C";
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x44;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  RET {}\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,local_18,in_stack_ffffffffffffffe0);
  if (((this->field_0).field_1.f & 0x10) == 0) {
    cycles = 4;
  }
  else {
    StackPop(this,&this->pc);
    cycles = 8;
  }
  Timer::AdvanceCycles(this->timer,cycles);
  return;
}

Assistant:

void SM83::ret() {
    if constexpr (cond == Conditions::None) {
        LTRACE("RET");
        
        StackPop(&pc);
        timer.AdvanceCycles(4);
    } else {
        LTRACE("RET {}", GetConditionString<cond>());

        if (MeetsCondition<cond>()) {
            StackPop(&pc);
            timer.AdvanceCycles(8);
        } else {
            timer.AdvanceCycles(4);
        }
    }
}